

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<32U,_5U,_buffer_layout_bfs>::operator()
          (fill<32U,_5U,_buffer_layout_bfs> *this,array<Stream,_32UL> *streams,uchar **buffer,
          array<unsigned_long,_32UL> *buffer_count)

{
  uchar *puVar1;
  uchar **ppuVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  uchar **ppuVar8;
  long lVar9;
  size_t __n;
  size_t sVar10;
  fill<32U,_10U,_buffer_layout_bfs> local_64;
  fill<32U,_11U,_buffer_layout_bfs> local_63;
  fill<32U,_11U,_buffer_layout_bfs> local_62;
  fill<32U,_10U,_buffer_layout_bfs> local_61;
  uchar **local_60;
  array<Stream,_32UL> *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  uchar **local_40;
  uchar **local_38;
  
  puVar6 = buffer_count->_M_elems + 10;
  local_48 = buffer_count->_M_elems + 0xb;
  local_38 = buffer + 0x1d8;
  local_40 = buffer + 0x28e;
  local_60 = buffer + 0x27;
  sVar10 = 0;
  lVar9 = 0;
  local_58 = streams;
  local_50 = puVar6;
  do {
    uVar4 = *puVar6;
    if (uVar4 == 0) {
      fill<32U,_10U,_buffer_layout_bfs>::operator()(&local_61,local_58,buffer,buffer_count);
      puVar6 = local_48;
      uVar4 = buffer_count->_M_elems[10];
      if (uVar4 == 0) {
        uVar4 = *local_48;
        __n = -lVar9;
        lVar9 = -sVar10;
        break;
      }
    }
    puVar7 = local_48;
    uVar5 = *local_48;
    if (uVar5 == 0) {
      fill<32U,_11U,_buffer_layout_bfs>::operator()(&local_62,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[10];
      uVar5 = buffer_count->_M_elems[0xb];
      if (uVar5 == 0) {
        __n = -lVar9;
        lVar9 = -sVar10;
        puVar6 = local_50;
        goto LAB_0013180c;
      }
    }
    ppuVar8 = local_38 + -uVar4 + 0xb6;
    ppuVar2 = local_40 + -uVar5 + 0xb6;
    iVar3 = cmp(buffer[-uVar4 + 0x28e],buffer[-uVar5 + 0x344]);
    puVar6 = local_50;
    if (iVar3 < 1) {
      puVar7 = local_50;
      ppuVar2 = ppuVar8;
    }
    puVar1 = *ppuVar2;
    *puVar7 = *puVar7 - 1;
    buffer[sVar10 + 0x27] = puVar1;
    check_input(local_60,sVar10);
    lVar9 = lVar9 + -8;
    sVar10 = sVar10 + 1;
    if (sVar10 == 0x17) {
      buffer_count->_M_elems[5] = 0x17;
      return;
    }
  } while( true );
  do {
    if (uVar4 == 0) {
      fill<32U,_11U,_buffer_layout_bfs>::operator()(&local_63,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0xb];
      if (uVar4 == 0) goto LAB_00131877;
    }
    *(uchar **)((long)buffer + __n + 0x138) = buffer[0x344 - uVar4];
    uVar4 = uVar4 - 1;
    *puVar6 = uVar4;
    lVar9 = lVar9 + -1;
    __n = __n + 8;
  } while (__n != 0xb8);
  goto LAB_00131860;
LAB_00131877:
  ppuVar8 = (uchar **)((long)buffer + (0x1f0 - __n));
  sVar10 = -lVar9;
  memmove(buffer + lVar9 + 0x3e,local_60,__n);
  buffer_count->_M_elems[5] = sVar10;
  goto LAB_001318ac;
  while( true ) {
    *(uchar **)((long)buffer + __n + 0x138) = buffer[0x28e - uVar4];
    uVar4 = uVar4 - 1;
    *puVar6 = uVar4;
    lVar9 = lVar9 + -1;
    __n = __n + 8;
    if (__n == 0xb8) break;
LAB_0013180c:
    if (uVar4 == 0) {
      fill<32U,_10U,_buffer_layout_bfs>::operator()(&local_64,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[10];
      puVar6 = local_50;
      if (uVar4 == 0) goto LAB_00131877;
    }
  }
LAB_00131860:
  buffer_count->_M_elems[5] = 0x17;
  sVar10 = 0x17;
  ppuVar8 = local_60;
LAB_001318ac:
  check_input(ppuVar8,sVar10);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}